

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int __thiscall
Solution::maximumsSplicedArray
          (Solution *this,vector<int,_std::allocator<int>_> *nums1,
          vector<int,_std::allocator<int>_> *nums2)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  vector<int,_std::allocator<int>_> diff;
  allocator_type local_45;
  value_type_conflict local_44;
  vector<int,_std::allocator<int>_> local_40;
  
  uVar10 = (uint)((ulong)((long)(nums1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(nums1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start) >> 2);
  local_44 = 0;
  std::vector<int,_std::allocator<int>_>::vector(&local_40,(long)(int)uVar10,&local_44,&local_45);
  if ((int)uVar10 < 1) {
    iVar6 = 0;
  }
  else {
    piVar2 = (nums1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    piVar3 = (nums2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    uVar9 = 0;
    iVar4 = 0;
    iVar5 = 0;
    do {
      iVar6 = piVar2[uVar9];
      iVar4 = iVar4 + iVar6;
      iVar7 = piVar3[uVar9];
      iVar5 = iVar5 + iVar7;
      local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar9] = iVar6 - iVar7;
      uVar9 = uVar9 + 1;
    } while ((uVar10 & 0x7fffffff) != uVar9);
    iVar6 = iVar5;
    if (iVar5 < iVar4) {
      iVar6 = iVar4;
    }
    if (uVar10 != 1) {
      iVar7 = *local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = 1;
      do {
        iVar1 = local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar9];
        if (iVar7 < 1) {
          if (iVar1 < 0) goto LAB_001019a3;
          iVar8 = iVar4 - iVar7;
          iVar7 = iVar1;
          if (iVar6 <= iVar8) {
            iVar6 = iVar8;
          }
        }
        else if (iVar1 < 1) {
          iVar8 = iVar7 + iVar5;
          iVar7 = iVar1;
          if (iVar6 <= iVar8) {
            iVar6 = iVar8;
          }
        }
        else {
LAB_001019a3:
          iVar7 = iVar1 + iVar7;
        }
        uVar9 = uVar9 + 1;
      } while ((uVar10 & 0x7fffffff) != uVar9);
    }
  }
  operator_delete(local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
  return iVar6;
}

Assistant:

int maximumsSplicedArray(vector<int>& nums1, vector<int>& nums2) {
        int n = nums1.size();
        int sum1 = 0, sum2 = 0;


        vector<int> diff(n, 0);
        for (int i = 0; i < n; i++) {
            sum1 += nums1[i];
            sum2 += nums2[i];
            diff[i] = nums1[i] - nums2[i];
        }


        int res = max(sum1, sum2);
        int accu = diff[0];
        for (int i = 1; i < n; i++) {
            if (accu > 0) {
                if (diff[i] > 0) accu += diff[i];
                else {
                    res = max(res, sum2 + abs(accu));
                    accu = diff[i];
                }
            } else {
                if (diff[i] < 0) accu += diff[i];
                else {
                    res = max(res, sum1 + abs(accu));
                    accu = diff[i];
                }
            }
        }



        return res;
    }